

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O1

int prvTidytmbstrncmp(ctmbstr s1,ctmbstr s2,uint n)

{
  uint uVar1;
  char cVar2;
  char cVar3;
  long lVar4;
  
  if (s2 == (ctmbstr)0x0 || s1 == (ctmbstr)0x0) {
    uVar1 = -(uint)(s1 == (ctmbstr)0x0) | 1;
    if (s1 == s2) {
      uVar1 = 0;
    }
  }
  else {
    cVar2 = *s1;
    cVar3 = *s2;
    if (cVar2 == cVar3) {
      lVar4 = 0;
      do {
        if (cVar2 == '\0') {
          return 0;
        }
        if (n == (uint)lVar4) {
          return 0;
        }
        cVar2 = s1[lVar4 + 1];
        cVar3 = s2[lVar4 + 1];
        lVar4 = lVar4 + 1;
      } while (cVar2 == cVar3);
      n = n - (int)lVar4;
    }
    uVar1 = 0;
    if (n != 0) {
      return (uint)(cVar3 < cVar2) * 2 + -1;
    }
  }
  return uVar1;
}

Assistant:

int TY_(tmbstrncmp)( ctmbstr s1, ctmbstr s2, uint n )
{
    uint c;

	if (s1 == NULL || s2 == NULL)
    {
        if (s1 == s2)
            return 0;
        return (s1 == NULL ? -1 : 1);
    }

    while ((c = (byte)*s1) == (byte)*s2)
    {
        if (c == '\0')
            return 0;

        if (n == 0)
            return 0;

        ++s1;
        ++s2;
        --n;
    }

    if (n == 0)
        return 0;

    return (*s1 > *s2 ? 1 : -1);
}